

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O0

void test_AString_appendAString_success_zeroSizeSrcArray_fn(int _i)

{
  AString string;
  AString string_00;
  bool bVar1;
  int iVar2;
  char *in_stack_fffffffffffffea0;
  uintmax_t _ck_y_6;
  uintmax_t _ck_x_8;
  uintmax_t _ck_y_5;
  uintmax_t _ck_x_7;
  char *_ck_y_q_1;
  char *_ck_x_q_1;
  char *_ck_y_s_1;
  char *_ck_x_s_1;
  char *_ck_y_4;
  char *_ck_x_6;
  void *_ck_x_5;
  uintmax_t _ck_y_3;
  uintmax_t _ck_x_4;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_3;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_1;
  char *_ck_x_2;
  void *_ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  AString srcString;
  AString destString;
  int _i_local;
  
  private_ACUtilsTest_AString_constructTestString((AString *)&srcString.buffer,"01234",8);
  private_ACUtilsTest_AString_constructTestString((AString *)&_ck_x,"",8);
  private_ACUtilsTest_AString_setReallocFail(false,0);
  bVar1 = AString_appendAString((AString *)&srcString.buffer,(AString *)&_ck_x);
  if (bVar1 == false) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x42c,"Assertion \'AString_appendAString(&destString, &srcString)\' failed",0
                     );
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x42c);
  if (destString.size != 8) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x42d,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","(destString).capacity == (8)"
                      ,"(destString).capacity",destString.size,"(8)",8,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x42d);
  if (destString.capacity == 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x42d,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) (destString).buffer != NULL",
                      "(void*) (destString).buffer",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x42d);
  if (destString.capacity == 0) {
    _ck_y_q = "";
    _ck_y_s = "(null)";
  }
  else {
    _ck_y_q = "\"";
    iVar2 = strcmp("01234",(char *)destString.capacity);
    _ck_y_s = (char *)destString.capacity;
    if (iVar2 == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x42d);
      if (destString.deallocator != (ACUtilsDeallocator)0x5) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x42d,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(destString).size == strlen(\"01234\")","(destString).size",
                          destString.deallocator,"strlen(\"01234\")",5,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x42d);
      if (srcString.size != 8) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x42e,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(srcString).capacity == (8)","(srcString).capacity",srcString.size,"(8)",
                          8,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x42e);
      if (srcString.capacity == 0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x42e,"Assertion \'_ck_x != NULL\' failed",
                          "Assertion \'%s\' failed: %s == %#x","(void*) (srcString).buffer != NULL",
                          "(void*) (srcString).buffer",0,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x42e);
      _ck_y_s_1 = (char *)srcString.capacity;
      if (srcString.capacity == 0) {
        _ck_y_q_1 = "";
        _ck_y_s_1 = "(null)";
      }
      else {
        _ck_y_q_1 = "\"";
        iVar2 = strcmp("",(char *)srcString.capacity);
        if (iVar2 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x42e);
          if (srcString.deallocator != (ACUtilsDeallocator)0x0) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x42e,"Assertion \'_ck_x == _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                              "(srcString).size == strlen(\"\")","(srcString).size",
                              srcString.deallocator,"strlen(\"\")",0,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x42e);
          if (private_ACUtilsTest_AString_reallocCount == 0) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x42f);
            string.deallocator = (ACUtilsDeallocator)0x5;
            string.reallocator = destString.reallocator;
            string.size = 8;
            string.capacity = destString.capacity;
            string.buffer = in_stack_fffffffffffffea0;
            private_ACUtilsTest_AString_destructTestString(string);
            string_00.deallocator = srcString.deallocator;
            string_00.reallocator = srcString.reallocator;
            string_00.size = srcString.size;
            string_00.capacity = srcString.capacity;
            string_00.buffer = in_stack_fffffffffffffea0;
            private_ACUtilsTest_AString_destructTestString(string_00);
            return;
          }
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x42f,"Assertion \'_ck_x == _ck_y\' failed",
                            "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                            "private_ACUtilsTest_AString_reallocCount == (0)",
                            "private_ACUtilsTest_AString_reallocCount",
                            private_ACUtilsTest_AString_reallocCount,"(0)",0,0);
        }
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x42e,
                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                        "(srcString).buffer == (\"\")","(srcString).buffer",_ck_y_q_1,_ck_y_s_1,
                        _ck_y_q_1,"(\"\")","\"","","\"",0);
    }
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x42d,
                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                    "(destString).buffer == (\"01234\")","(destString).buffer",_ck_y_q,_ck_y_s,
                    _ck_y_q,"(\"01234\")","\"","01234","\"",0);
}

Assistant:

END_TEST
START_TEST(test_AString_appendAString_success_zeroSizeSrcArray)
{
    struct AString destString = private_ACUtilsTest_AString_constructTestString("01234", 8);
    struct AString srcString = private_ACUtilsTest_AString_constructTestString("", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_appendAString(&destString, &srcString));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(destString, "01234", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(srcString, "", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(destString);
    private_ACUtilsTest_AString_destructTestString(srcString);
}